

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

int rludecomp(double *A,int M,int N,int *ipiv)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  double *pdVar4;
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double *pdVar14;
  ulong uVar15;
  double *pdVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  ulong local_48;
  
  if (0 < M) {
    uVar11 = 0;
    do {
      ipiv[uVar11] = (int)uVar11;
      uVar11 = uVar11 + 1;
    } while ((uint)M != uVar11);
  }
  if (N < M) {
    if (0 < N) {
      uVar9 = (ulong)(uint)N;
      pdVar6 = A + uVar9;
      local_48 = 1;
      uVar11 = 0;
      pdVar14 = A;
      uVar17 = uVar9;
      pdVar16 = A;
      do {
        uVar10 = (uint)uVar11;
        uVar8 = uVar10 * N;
        dVar20 = A[uVar11 + uVar8];
        uVar15 = uVar11 + 1;
        if ((long)uVar15 < (long)M) {
          dVar21 = ABS(dVar20);
          uVar12 = uVar11 & 0xffffffff;
          uVar7 = local_48;
          pdVar4 = pdVar6;
          do {
            dVar22 = ABS(*pdVar4);
            if (dVar21 < dVar22) {
              uVar12 = uVar7 & 0xffffffff;
            }
            uVar10 = (uint)uVar12;
            uVar18 = -(ulong)(dVar21 < dVar22);
            dVar21 = (double)(~uVar18 & (ulong)dVar21 | (ulong)*pdVar4 & uVar18);
            uVar7 = uVar7 + 1;
            pdVar4 = pdVar4 + uVar9;
          } while ((uint)M != uVar7);
        }
        if (uVar11 != uVar10) {
          iVar3 = ipiv[(int)uVar10];
          ipiv[(int)uVar10] = ipiv[uVar11];
          ipiv[uVar11] = iVar3;
          uVar7 = 0;
          do {
            dVar20 = pdVar14[uVar7];
            pdVar14[uVar7] = A[(long)(int)(uVar10 * N) + uVar7];
            A[(long)(int)(uVar10 * N) + uVar7] = dVar20;
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
          dVar20 = A[uVar11 + uVar8];
        }
        pdVar4 = pdVar6;
        uVar7 = local_48;
        if (dVar20 != 0.0 && (long)uVar15 < (long)M) {
          do {
            dVar21 = A[uVar11 + uVar7 * uVar9];
            A[uVar11 + uVar7 * uVar9] = dVar21 / dVar20;
            if (uVar15 < uVar9) {
              uVar12 = 1;
              do {
                pdVar4[uVar12] = pdVar16[uVar12] * -(dVar21 / dVar20) + pdVar4[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar17 != uVar12);
            }
            uVar7 = uVar7 + 1;
            pdVar4 = pdVar4 + uVar9;
          } while (uVar7 != (uint)M);
        }
        local_48 = local_48 + 1;
        pdVar6 = pdVar6 + uVar9 + 1;
        pdVar14 = pdVar14 + uVar9;
        pdVar16 = pdVar16 + uVar9 + 1;
        uVar17 = uVar17 - 1;
        uVar11 = uVar15;
      } while (uVar15 != uVar9);
    }
  }
  else if (M < N) {
    if (1 < M) {
      lVar13 = (long)N;
      pdVar6 = A + lVar13;
      uVar9 = 1;
      uVar15 = 0;
      uVar11 = 0;
      pdVar14 = A;
      uVar17 = (ulong)(uint)N;
      pdVar16 = A;
      do {
        lVar5 = (long)((int)uVar11 * N);
        dVar20 = A[uVar11 + lVar5];
        uVar7 = uVar11 + 1;
        dVar21 = ABS(dVar20);
        uVar12 = uVar11;
        pdVar4 = pdVar6;
        uVar18 = uVar9;
        do {
          dVar22 = ABS(*pdVar4);
          uVar2 = uVar12;
          if (dVar21 < dVar22) {
            uVar2 = uVar18;
          }
          uVar12 = uVar2 & 0xffffffff;
          uVar19 = -(ulong)(dVar21 < dVar22);
          dVar21 = (double)(~uVar19 & (ulong)dVar21 | (ulong)*pdVar4 & uVar19);
          uVar18 = uVar18 + 1;
          pdVar4 = pdVar4 + lVar13;
        } while ((uint)M != uVar18);
        iVar3 = (int)uVar2;
        if (uVar11 != (uVar2 & 0xffffffff)) {
          iVar1 = ipiv[iVar3];
          ipiv[iVar3] = ipiv[uVar11];
          ipiv[uVar11] = iVar1;
          uVar12 = 0;
          do {
            dVar20 = A[uVar15 + uVar12];
            pdVar14[uVar12] = A[(long)(iVar3 * N) + uVar12];
            A[(long)(iVar3 * N) + uVar12] = dVar20;
            uVar12 = uVar12 + 1;
          } while ((uint)N != uVar12);
          dVar20 = A[uVar11 + lVar5];
        }
        pdVar4 = pdVar6;
        uVar12 = uVar9;
        if ((dVar20 != 0.0) || (NAN(dVar20))) {
          do {
            dVar21 = A[uVar11 + uVar12 * lVar13];
            A[uVar11 + uVar12 * lVar13] = dVar21 / dVar20;
            if ((long)uVar7 < lVar13) {
              uVar18 = 1;
              do {
                pdVar4[uVar18] = pdVar16[uVar18] * -(dVar21 / dVar20) + pdVar4[uVar18];
                uVar18 = uVar18 + 1;
              } while (uVar17 != uVar18);
            }
            uVar12 = uVar12 + 1;
            pdVar4 = pdVar4 + lVar13;
          } while (uVar12 != (uint)M);
        }
        uVar9 = uVar9 + 1;
        pdVar6 = pdVar6 + lVar13 + 1;
        uVar15 = (ulong)(uint)((int)uVar15 + N);
        pdVar14 = pdVar14 + lVar13;
        pdVar16 = pdVar16 + lVar13 + 1;
        uVar17 = uVar17 - 1;
        uVar11 = uVar7;
      } while (uVar7 != M - 1);
    }
  }
  else if (M == N) {
    pludecomp(A,M,ipiv);
  }
  return 0;
}

Assistant:

int rludecomp(double *A, int M, int N, int *ipiv) {
	int k, j, l, c1, c2, mind, tempi;
	double ld, mult, mval, temp;


	for (k = 0; k < M; ++k)
		ipiv[k] = (double) k;

	if (M > N) {
		for (k = 0; k < N; ++k) {
			mval = fabs(A[k*N + k]);
			mind = k;
			for (j = k + 1; j < M; ++j) {
				if (mval < fabs(A[j*N + k])) {
					mval = A[j*N + k];
					mind = j;
				}
			}

			if (mind != k) {
				c1 = k *N;
				c2 = mind * N;
				tempi = ipiv[mind];
				ipiv[mind] = ipiv[k];
				ipiv[k] = tempi;
				for (j = 0; j < N; j++) {
					temp = A[c1 + j];
					*(A + c1 + j) = *(A + c2 + j);
					*(A + c2 + j) = temp;
				}
			}

			c2 = k*N;
			ld = A[c2 + k];
			if (ld != 0. && k < N) {
				for (j = k + 1; j < M; ++j) {
					c1 = j*N;
					mult = A[c1 + k] /= ld;
					//printf("\n k %d j %d mult %f \n",k,j,mult);
					for (l = k + 1; l < N; ++l) {
						A[c1 + l] -= mult * A[c2 + l];
					}
				}
			}
		}
	}
	else if (M < N) {
		for (k = 0; k < M-1; ++k) {
			mval = fabs(A[k*N + k]);
			mind = k;
			for (j = k + 1; j < M; ++j) {
				if (mval < fabs(A[j*N + k])) {
					mval = A[j*N + k];
					mind = j;
				}
			}

			if (mind != k) {
				c1 = k *N;
				c2 = mind * N;
				tempi = ipiv[mind];
				ipiv[mind] = ipiv[k];
				ipiv[k] = tempi;
				for (j = 0; j < N; j++) {
					temp = A[c1 + j];
					*(A + c1 + j) = *(A + c2 + j);
					*(A + c2 + j) = temp;
				}
			}

			c2 = k*N;
			ld = A[c2 + k];
			if (ld != 0.) {
				for (j = k + 1; j < M; ++j) {
					c1 = j*N;
					mult = A[c1 + k] /= ld;
					//printf("\n k %d j %d mult %f \n",k,j,mult);
					for (l = k + 1; l < N; ++l) {
						A[c1 + l] -= mult * A[c2 + l];
					}
				}
			}
		}
	}
	else if (M == N) {
		pludecomp(A,N,ipiv);
	}

	//mdisplay(ipiv, 1, M);

	return 0;

	
}